

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

void PairSearchHelper(ON_RTreeBranch *a_branchA,ON_RTreeNode *a_nodeB,
                     ON_RTreePairSearchResult *a_result)

{
  int iVar1;
  bool bVar2;
  ON_2dex *pOVar3;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar4;
  int *piVar5;
  
  iVar1 = a_nodeB->m_count;
  if (0 < (long)iVar1) {
    paVar4 = &a_nodeB->m_branch[0].field_1;
    do {
      bVar2 = PairSearchOverlapHelper
                        (&a_branchA->m_rect,(ON_RTreeBBox *)(paVar4 + -6),a_result->m_tolerance);
      if (bVar2) {
        if (a_nodeB->m_level < 1) {
          pOVar3 = ON_SimpleArray<ON_2dex>::AppendNew(a_result->m_result);
          pOVar3->i = *(int *)&a_branchA->field_1;
          pOVar3->j = *(int *)paVar4;
        }
        else {
          PairSearchHelper(a_branchA,paVar4->m_child,a_result);
        }
      }
      piVar5 = (int *)(paVar4 + 1);
      paVar4 = paVar4 + 7;
    } while (piVar5 < a_nodeB->m_branch + iVar1);
  }
  return;
}

Assistant:

static void PairSearchHelper( const ON_RTreeBranch* a_branchA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchResult* a_result )
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchB, *branchBmax;

  branchB = a_nodeB->m_branch;
  branchBmax = branchB + a_nodeB->m_count;
  while(branchB < branchBmax)
  {
    if ( PairSearchOverlapHelper( &a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance ) )
    {
      if ( a_nodeB->m_level > 0 )
      {
        PairSearchHelper(a_branchA,branchB->m_child,a_result);
      }
      else
      {
        ON_2dex& r = a_result->m_result->AppendNew();
        r.i = (int)a_branchA->m_id;
        r.j = (int)branchB->m_id;
      }
    }
    branchB++;
  }
}